

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iob.c
# Opt level: O3

int tnt_iob_init(tnt_iob *iob,size_t size,tnt_iob_tx_t tx,tnt_iob_txv_t txv,void *ptr)

{
  char *__s;
  int iVar1;
  
  iob->tx = tx;
  iob->txv = txv;
  iob->ptr = ptr;
  iob->size = size;
  iob->buf = (char *)0x0;
  iob->off = 0;
  iob->top = 0;
  if (size == 0) {
    iVar1 = 0;
  }
  else {
    __s = (char *)tnt_mem_alloc(size);
    iob->buf = __s;
    if (__s == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = 0;
      memset(__s,0,size);
    }
  }
  return iVar1;
}

Assistant:

int
tnt_iob_init(struct tnt_iob *iob, size_t size,
	     tnt_iob_tx_t tx,
	     tnt_iob_txv_t txv, void *ptr)
{
	iob->tx = tx;
	iob->txv = txv;
	iob->ptr = ptr;
	iob->size = size;
	iob->off = 0;
	iob->top = 0;
	iob->buf = NULL;
	if (size > 0) {
		iob->buf = tnt_mem_alloc(size);
		if (iob->buf == NULL)
			return -1;
		memset(iob->buf, 0, size);
	}
	return 0;
}